

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O2

void __thiscall
test::syntax_tests::iu_TypedPrintToTest_x_iutest_x_Print_Test<long>::
iu_TypedPrintToTest_x_iutest_x_Print_Test(iu_TypedPrintToTest_x_iutest_x_Print_Test<long> *this)

{
  TypedPrintToTest<long>::TypedPrintToTest(&this->super_TypedPrintToTest<long>);
  (this->super_TypedPrintToTest<long>).super_Test._vptr_Test = (_func_int **)&PTR__Test_003a07c8;
  return;
}

Assistant:

IUTEST_TYPED_TEST(TypedPrintToTest, Print)
{
    TypeParam a = 0;
    TypeParam& b = a;
    const TypeParam c = a;
    const volatile TypeParam d = a;

    IUTEST_SUCCEED() << ::iutest::PrintToString(a);
    IUTEST_SUCCEED() << ::iutest::PrintToString(b);
    IUTEST_SUCCEED() << ::iutest::PrintToString(c);
    IUTEST_SUCCEED() << ::iutest::PrintToString(d);
}